

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void base_init(base_t *base,void *base_mem,uint32 max_vocab,uint8 remaining_bits)

{
  uint8 uVar1;
  uint8 remaining_bits_local;
  uint32 max_vocab_local;
  void *base_mem_local;
  base_t *base_local;
  
  uVar1 = bitarr_required_bits(max_vocab);
  base->word_bits = uVar1;
  base->word_mask = (1 << (base->word_bits & 0x1f)) - 1;
  if (0x19 < base->word_bits) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x5c,
            "Sorry, word indices more than %d are not implemented.  Edit util/bit_packing.hh and fix the bit packing functions\n"
            ,0x2000000);
  }
  base->total_bits = base->word_bits + remaining_bits;
  base->base = (uint8 *)base_mem;
  base->insert_index = 0;
  base->max_vocab = max_vocab;
  return;
}

Assistant:

static void
base_init(base_t * base, void *base_mem, uint32 max_vocab,
          uint8 remaining_bits)
{
    base->word_bits = bitarr_required_bits(max_vocab);
    base->word_mask = (1U << base->word_bits) - 1U;
    if (base->word_bits > 25)
        E_ERROR
            ("Sorry, word indices more than %d are not implemented.  Edit util/bit_packing.hh and fix the bit packing functions\n",
             (1U << 25));
    base->total_bits = base->word_bits + remaining_bits;

    base->base = (uint8 *) base_mem;
    base->insert_index = 0;
    base->max_vocab = max_vocab;
}